

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidobjs.c
# Opt level: O1

void cid_face_done(FT_Face cidface)

{
  FT_Memory memory;
  long lVar1;
  CID_Face face;
  long lVar2;
  long lVar3;
  
  if (cidface != (FT_Face)0x0) {
    memory = cidface->memory;
    if (cidface[2].bbox.xMin != 0) {
      if (0 < cidface[2].num_charmaps) {
        lVar3 = 8;
        lVar2 = 0;
        do {
          lVar1 = cidface[2].bbox.xMin;
          if (*(undefined8 **)(lVar1 + lVar3) != (undefined8 *)0x0) {
            ft_mem_free(memory,(void *)**(undefined8 **)(lVar1 + lVar3));
            **(undefined8 **)(lVar1 + lVar3) = 0;
            ft_mem_free(memory,*(void **)(lVar1 + lVar3));
            *(undefined8 *)(lVar1 + lVar3) = 0;
          }
          lVar2 = lVar2 + 1;
          lVar3 = lVar3 + 0x10;
        } while (lVar2 < cidface[2].num_charmaps);
      }
      ft_mem_free(memory,(void *)cidface[2].bbox.xMin);
      cidface[2].bbox.xMin = 0;
    }
    ft_mem_free(memory,cidface[1].available_sizes);
    cidface[1].available_sizes = (FT_Bitmap_Size *)0x0;
    ft_mem_free(memory,*(void **)&cidface[1].num_charmaps);
    *(undefined8 *)&cidface[1].num_charmaps = 0;
    ft_mem_free(memory,cidface[1].charmaps);
    cidface[1].charmaps = (FT_CharMap *)0x0;
    ft_mem_free(memory,cidface[1].generic.data);
    cidface[1].generic.data = (void *)0x0;
    ft_mem_free(memory,cidface[1].generic.finalizer);
    cidface[1].generic.finalizer = (FT_Generic_Finalizer)0x0;
    ft_mem_free(memory,cidface[2].charmaps);
    cidface[2].charmaps = (FT_CharMap *)0x0;
    cidface[2].num_charmaps = 0;
    ft_mem_free(memory,(void *)cidface[1].face_flags);
    cidface[1].face_flags = 0;
    ft_mem_free(memory,cidface[1].family_name);
    cidface[1].family_name = (FT_String *)0x0;
    ft_mem_free(memory,cidface[1].style_name);
    cidface[1].style_name = (FT_String *)0x0;
    cidface->family_name = (FT_String *)0x0;
    cidface->style_name = (FT_String *)0x0;
    ft_mem_free(memory,(void *)cidface[2].bbox.xMax);
    cidface[2].bbox.xMax = 0;
    ft_mem_free(memory,(void *)cidface[2].bbox.yMax);
    cidface[2].bbox.yMax = 0;
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  cid_face_done( FT_Face  cidface )         /* CID_Face */
  {
    CID_Face      face = (CID_Face)cidface;
    FT_Memory     memory;
    CID_FaceInfo  cid;
    PS_FontInfo   info;


    if ( !face )
      return;

    cid    = &face->cid;
    info   = &cid->font_info;
    memory = cidface->memory;

    /* release subrs */
    if ( face->subrs )
    {
      FT_Int  n;


      for ( n = 0; n < cid->num_dicts; n++ )
      {
        CID_Subrs  subr = face->subrs + n;


        if ( subr->code )
        {
          FT_FREE( subr->code[0] );
          FT_FREE( subr->code );
        }
      }

      FT_FREE( face->subrs );
    }

    /* release FontInfo strings */
    FT_FREE( info->version );
    FT_FREE( info->notice );
    FT_FREE( info->full_name );
    FT_FREE( info->family_name );
    FT_FREE( info->weight );

    /* release font dictionaries */
    FT_FREE( cid->font_dicts );
    cid->num_dicts = 0;

    /* release other strings */
    FT_FREE( cid->cid_font_name );
    FT_FREE( cid->registry );
    FT_FREE( cid->ordering );

    cidface->family_name = NULL;
    cidface->style_name  = NULL;

    FT_FREE( face->binary_data );
    FT_FREE( face->cid_stream );
  }